

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

Path * __thiscall tinyusdz::Path::get_parent_path(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  long lVar2;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (this->_valid == false) {
LAB_00213b53:
    Path(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  bVar1 = is_root_path(this);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"",&local_62);
    ::std::__cxx11::string::string((string *)&local_60,"",&local_61);
    Path(__return_storage_ptr__,&local_40,&local_60);
  }
  else {
    if (((this->_prim_part)._M_string_length != 0) && ((this->_prop_part)._M_string_length != 0)) {
      ::std::__cxx11::string::string((string *)&local_40,"",(allocator *)&local_60);
      Path(__return_storage_ptr__,&this->_prim_part,&local_40);
      goto LAB_00213b33;
    }
    lVar2 = ::std::__cxx11::string::rfind((char)this,0x2f);
    if (lVar2 == 0) {
      ::std::__cxx11::string::string((string *)&local_40,"/",&local_62);
      ::std::__cxx11::string::string((string *)&local_60,"",&local_61);
      Path(__return_storage_ptr__,&local_40,&local_60);
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00213b33;
    }
    if (lVar2 == -1) goto LAB_00213b53;
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
    ::std::__cxx11::string::string((string *)&local_60,"",&local_62);
    Path(__return_storage_ptr__,&local_40,&local_60);
  }
  ::std::__cxx11::string::_M_dispose();
LAB_00213b33:
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_path()) {
    Path p("", "");
    return p;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // relative path(e.g. "bora") or propery only path(e.g. ".myval").
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}